

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::CombineAccessChains::CombineIndices
          (CombineAccessChains *this,Instruction *ptr_input,Instruction *inst,
          vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *new_operands)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t op2;
  DefUseManager *this_00;
  ConstantManager *this_01;
  Instruction *pIVar4;
  Constant *pCVar5;
  Instruction *inst_00;
  Constant *constant_inst;
  Type *pTVar6;
  undefined4 extraout_var;
  CombineAccessChains *this_02;
  bool bVar7;
  initializer_list<unsigned_int> init_list;
  uint32_t local_8c;
  InstructionBuilder builder;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  this_01 = IRContext::get_constant_mgr((this->super_Pass).context_);
  uVar1 = Instruction::NumInOperands(ptr_input);
  uVar1 = Instruction::GetSingleWordInOperand(ptr_input,uVar1 - 1);
  pIVar4 = analysis::DefUseManager::GetDef(this_00,uVar1);
  pCVar5 = analysis::ConstantManager::GetConstantFromInst(this_01,pIVar4);
  uVar1 = Instruction::GetSingleWordInOperand(inst,1);
  inst_00 = analysis::DefUseManager::GetDef(this_00,uVar1);
  constant_inst = analysis::ConstantManager::GetConstantFromInst(this_01,inst_00);
  if (((inst->opcode_ == OpInBoundsPtrAccessChain) || (inst->opcode_ == OpPtrAccessChain)) &&
     ((ptr_input->opcode_ == OpInBoundsPtrAccessChain || (ptr_input->opcode_ == OpPtrAccessChain))))
  {
    uVar1 = Instruction::NumInOperands(ptr_input);
    bVar7 = uVar1 == 2;
  }
  else {
    bVar7 = false;
  }
  this_02 = this;
  pTVar6 = GetIndexedType(this,ptr_input);
  if (constant_inst == (Constant *)0x0 || pCVar5 == (Constant *)0x0) {
    iVar3 = (*pTVar6->_vptr_Type[0x1c])(pTVar6);
    if ((bool)(~bVar7 & CONCAT44(extraout_var,iVar3) != 0)) {
      return false;
    }
    InstructionBuilder::InstructionBuilder
              (&builder,(this->super_Pass).context_,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin
              );
    uVar1 = Instruction::type_id(pIVar4);
    uVar2 = Instruction::result_id(pIVar4);
    op2 = Instruction::result_id(inst_00);
    pIVar4 = InstructionBuilder::AddIAdd(&builder,uVar1,uVar2,op2);
  }
  else {
    uVar1 = GetConstantValue(this_02,pCVar5);
    uVar2 = GetConstantValue(this_02,constant_inst);
    local_58._vptr_SmallVector._0_4_ = uVar2 + uVar1;
    pTVar6 = pCVar5->type_;
    builder.context_ = (IRContext *)0x0;
    builder.parent_ = (BasicBlock *)0x0;
    builder.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&builder,&local_58);
    pCVar5 = analysis::ConstantManager::GetConstant
                       (this_01,pTVar6,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&builder);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&builder);
    pIVar4 = analysis::ConstantManager::GetDefiningInstruction
                       (this_01,pCVar5,0,(inst_iterator *)0x0);
  }
  local_8c = Instruction::result_id(pIVar4);
  init_list._M_len = 1;
  init_list._M_array = &local_8c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  builder.context_ = (IRContext *)CONCAT44(builder.context_._4_4_,1);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&builder.parent_,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(new_operands,(Operand *)&builder);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&builder.parent_);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  return true;
}

Assistant:

bool CombineAccessChains::CombineIndices(Instruction* ptr_input,
                                         Instruction* inst,
                                         std::vector<Operand>* new_operands) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::ConstantManager* constant_mgr = context()->get_constant_mgr();

  Instruction* last_index_inst = def_use_mgr->GetDef(
      ptr_input->GetSingleWordInOperand(ptr_input->NumInOperands() - 1));
  const analysis::Constant* last_index_constant =
      constant_mgr->GetConstantFromInst(last_index_inst);

  Instruction* element_inst =
      def_use_mgr->GetDef(inst->GetSingleWordInOperand(1));
  const analysis::Constant* element_constant =
      constant_mgr->GetConstantFromInst(element_inst);

  // Combine the last index of the AccessChain (|ptr_inst|) with the element
  // operand of the PtrAccessChain (|inst|).
  const bool combining_element_operands =
      IsPtrAccessChain(inst->opcode()) &&
      IsPtrAccessChain(ptr_input->opcode()) && ptr_input->NumInOperands() == 2;
  uint32_t new_value_id = 0;
  const analysis::Type* type = GetIndexedType(ptr_input);
  if (last_index_constant && element_constant) {
    // Combine the constants.
    uint32_t new_value = GetConstantValue(last_index_constant) +
                         GetConstantValue(element_constant);
    const analysis::Constant* new_value_constant =
        constant_mgr->GetConstant(last_index_constant->type(), {new_value});
    Instruction* new_value_inst =
        constant_mgr->GetDefiningInstruction(new_value_constant);
    new_value_id = new_value_inst->result_id();
  } else if (!type->AsStruct() || combining_element_operands) {
    // Generate an addition of the two indices.
    InstructionBuilder builder(
        context(), inst,
        IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
    Instruction* addition = builder.AddIAdd(last_index_inst->type_id(),
                                            last_index_inst->result_id(),
                                            element_inst->result_id());
    new_value_id = addition->result_id();
  } else {
    // Indexing into structs must be constant, so bail out here.
    return false;
  }
  new_operands->push_back({SPV_OPERAND_TYPE_ID, {new_value_id}});
  return true;
}